

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O0

string * __thiscall
I18N::Format<std::__cxx11::string&>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  initializer_list<util::variant> __l;
  variant *local_d0;
  allocator<util::variant> local_a5 [13];
  variant *local_98;
  variant local_90;
  iterator local_50;
  double local_48;
  undefined1 local_40 [8];
  vector<util::variant,_std::allocator<util::variant>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  string *id_local;
  I18N *this_local;
  
  local_98 = &local_90;
  v.super__Vector_base<util::variant,_std::allocator<util::variant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)args;
  util::variant::variant(local_98,args);
  local_50 = &local_90;
  local_48 = 4.94065645841247e-324;
  std::allocator<util::variant>::allocator(local_a5);
  __l._M_len = (size_type)local_48;
  __l._M_array = local_50;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector
            ((vector<util::variant,_std::allocator<util::variant>_> *)local_40,__l,local_a5);
  std::allocator<util::variant>::~allocator(local_a5);
  local_d0 = (variant *)&local_50;
  do {
    local_d0 = local_d0 + -1;
    util::variant::~variant(local_d0);
  } while (local_d0 != &local_90);
  FormatV(__return_storage_ptr__,this,id,
          (vector<util::variant,_std::allocator<util::variant>_> *)local_40);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector
            ((vector<util::variant,_std::allocator<util::variant>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}